

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::
CommandDomainReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&)::$_0::
~__0(__0 *this)

{
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::_Function_base::~_Function_base((_Function_base *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::CommandDomainReset(const std::string &aDstAddr)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    CommandDomainReset(wait, aDstAddr);
    return pro.get_future().get();
}